

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConditionalPredicateSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalPredicateSyntax,slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>const&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *args)

{
  ConditionalPredicateSyntax *this_00;
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ConditionalPredicateSyntax *)allocate(this,0x40,8);
  slang::syntax::ConditionalPredicateSyntax::ConditionalPredicateSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }